

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_block.cpp
# Opt level: O1

int CfdGetTransactionFromBlock(void *handle,void *block_handle,char *txid,char **tx_hex)

{
  vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *pvVar1;
  Block *this;
  bool bVar2;
  char *pcVar3;
  CfdException *pCVar4;
  Transaction tx;
  allocator local_b1;
  Transaction local_b0;
  undefined1 local_70 [32];
  string local_50;
  
  cfd::Initialize();
  pvVar1 = &local_b0.vin_;
  local_b0.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"BlockOpe","");
  cfd::capi::CheckBuffer(block_handle,(string *)&local_b0);
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      local_b0.super_AbstractTransaction._vptr_AbstractTransaction != pvVar1) {
    operator_delete(local_b0.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  if (tx_hex == (char **)0x0) {
    local_b0.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x5f2bbe;
    local_b0.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x103;
    local_b0.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x5f2cc6;
    cfd::core::logger::log<>((CfdSourceLocation *)&local_b0,kCfdLogLevelWarning,"tx_hex is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_b0.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)pvVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"Failed to parameter. tx_hex is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_b0);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = cfd::capi::IsEmptyString(txid);
  if (bVar2) {
    local_b0.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x5f2bbe;
    local_b0.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x109;
    local_b0.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x5f2cc6;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_b0,kCfdLogLevelWarning,"txid is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_b0.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)pvVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"Failed to parameter. txid is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_b0);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  this = *(Block **)((long)block_handle + 0x18);
  if (this != (Block *)0x0) {
    if (*(int *)((long)block_handle + 0x10) < 3) {
      std::__cxx11::string::string((string *)&local_50,txid,&local_b1);
      cfd::core::Txid::Txid((Txid *)local_70,&local_50);
      cfd::core::Block::GetTransaction(&local_b0,this,(Txid *)local_70);
      local_70._0_8_ = &PTR__Txid_00735400;
      if ((pointer)local_70._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_70._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_
                ((string *)local_70,&local_b0.super_AbstractTransaction);
      pcVar3 = cfd::capi::CreateString((string *)local_70);
      *tx_hex = pcVar3;
      if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
        operator_delete((void *)local_70._0_8_);
      }
      cfd::core::Transaction::~Transaction(&local_b0);
      return 0;
    }
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_b0.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)pvVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"Elements is not supported.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_b0);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_b0.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"Invalid handle state. block is null","");
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&local_b0);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTransactionFromBlock(
    void* handle, void* block_handle, const char* txid, char** tx_hex) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(block_handle, kPrefixBlock);
    CfdCapiBlockData* block_data =
        static_cast<CfdCapiBlockData*>(block_handle);
    if (tx_hex == nullptr) {
      warn(CFD_LOG_SOURCE, "tx_hex is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx_hex is null.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }

    if (block_data->block == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. block is null");
    } else if (block_data->net_type <= NetType::kRegtest) {
      auto tx = block_data->block->GetTransaction(Txid(std::string(txid)));
      *tx_hex = CreateString(tx.GetHex());
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}